

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDScanner::scanEntityDecl(DTDScanner *this)

{
  XMLReader *pXVar1;
  XMLBufferMgr *this_00;
  XMLCh *pXVar2;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *this_01;
  DTDGrammar *this_02;
  DTDEntityDecl *pDVar3;
  DocTypeHandler *pDVar4;
  XMLScanner *this_03;
  bool bVar5;
  bool bVar6;
  XMLCh XVar7;
  int iVar8;
  DTDEntityDecl *pDVar9;
  bool isPEDecl;
  XMLBufBid bbName;
  
  bVar5 = ReaderMgr::lookingAtSpace(this->fReaderMgr);
  if (bVar5) {
    ReaderMgr::skipPastSpaces(this->fReaderMgr);
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
  if (bVar5) {
    pXVar1 = this->fReaderMgr->fCurReader;
    XVar7 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if ((char)pXVar1->fgCharCharsTable[(ushort)XVar7] < '\0') {
      bVar5 = checkForPERef(this,false,true);
      isPEDecl = true;
      if (!bVar5) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
      }
      goto LAB_002f9f84;
    }
    do {
      bVar5 = expandPERef(this,false,false,true,false);
      if (!bVar5) {
        XMLScanner::emitError(this->fScanner,ExpectedEntityRefName);
      }
      bVar5 = ReaderMgr::skippedSpace(this->fReaderMgr);
      if (bVar5) {
        ReaderMgr::skipPastSpaces(this->fReaderMgr);
      }
      bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
    } while (bVar5);
  }
  isPEDecl = false;
LAB_002f9f84:
  this_00 = this->fBufMgr;
  bbName.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbName.fMgr = this_00;
  bVar5 = ReaderMgr::getName(this->fReaderMgr,bbName.fBuffer);
  if (bVar5) {
    if (this->fScanner->fDoNamespaces == true) {
      pXVar2 = (bbName.fBuffer)->fBuffer;
      pXVar2[(bbName.fBuffer)->fIndex] = L'\0';
      iVar8 = XMLString::indexOf(pXVar2,L':');
      if (iVar8 != -1) {
        XMLScanner::emitError(this->fScanner,ColonNotLegalWithNS);
      }
    }
    pXVar2 = (bbName.fBuffer)->fBuffer;
    if (isPEDecl == false) {
      this_02 = this->fDTDGrammar;
      pXVar2[(bbName.fBuffer)->fIndex] = L'\0';
      pDVar9 = DTDGrammar::getEntityDecl(this_02,pXVar2);
    }
    else {
      this_01 = this->fPEntityDeclPool;
      pXVar2[(bbName.fBuffer)->fIndex] = L'\0';
      pDVar9 = NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(this_01,pXVar2);
    }
    if (pDVar9 == (DTDEntityDecl *)0x0) {
      pDVar9 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fGrammarPoolMemoryManager);
      pXVar2 = (bbName.fBuffer)->fBuffer;
      pXVar2[(bbName.fBuffer)->fIndex] = L'\0';
      DTDEntityDecl::DTDEntityDecl(pDVar9,pXVar2,false,this->fGrammarPoolMemoryManager);
      pDVar9->fDeclaredInIntSubset = this->fInternalSubset;
      if (isPEDecl == false) {
        DTDGrammar::putEntityDecl(this->fDTDGrammar,pDVar9);
      }
      else {
        NameIdPool<xercesc_4_0::DTDEntityDecl>::put(this->fPEntityDeclPool,pDVar9);
      }
    }
    else {
      pDVar9 = this->fDumEntityDecl;
      if (pDVar9 == (DTDEntityDecl *)0x0) {
        pDVar9 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fMemoryManager);
        DTDEntityDecl::DTDEntityDecl(pDVar9,this->fMemoryManager);
        this->fDumEntityDecl = pDVar9;
      }
      pXVar2 = (bbName.fBuffer)->fBuffer;
      pXVar2[(bbName.fBuffer)->fIndex] = L'\0';
      XMLEntityDecl::setName(&pDVar9->super_XMLEntityDecl,pXVar2);
      pDVar9 = this->fDumEntityDecl;
    }
    pDVar3 = this->fDumEntityDecl;
    pDVar9->fIsParameter = isPEDecl;
    bVar5 = checkForPERef(this,false,true);
    if (!bVar5) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    bVar5 = this->fScanner->fHasNoDTD;
    if ((isPEDecl & bVar5) == 1) {
      this->fScanner->fHasNoDTD = false;
    }
    bVar6 = scanEntityDef(this,pDVar9,isPEDecl);
    if (bVar6) {
      if (bVar5 != false) {
        this->fScanner->fHasNoDTD = true;
      }
      checkForPERef(this,false,true);
      bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
      if (!bVar5) {
        XMLScanner::emitError
                  (this->fScanner,UnterminatedEntityDecl,(pDVar9->super_XMLEntityDecl).fName,
                   (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      pDVar4 = this->fDocTypeHandler;
      if (pDVar4 != (DocTypeHandler *)0x0) {
        (*pDVar4->_vptr_DocTypeHandler[0xb])
                  (pDVar4,pDVar9,(ulong)isPEDecl,(ulong)(pDVar9 == pDVar3));
      }
    }
    else {
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      this_03 = this->fScanner;
      this_03->fHasNoDTD = true;
      XMLScanner::emitError(this_03,ExpectedEntityValue);
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedPEName);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  XMLBufBid::~XMLBufBid(&bbName);
  return;
}

Assistant:

void DTDScanner::scanEntityDecl()
{
    //
    //  Space is required here, but we cannot check for a PE Ref since
    //  there could be a legal (no-ref) percent sign here. Since any
    //  entity that ended here would be illegal, we just skip spaces
    //  and then check for a percent.
    //
    if (!fReaderMgr->lookingAtSpace())
        fScanner->emitError(XMLErrs::ExpectedWhitespace);
    else
        fReaderMgr->skipPastSpaces();
    bool isPEDecl = fReaderMgr->skippedChar(chPercent);

    //
    //  If a PE decl, then check if it is followed by a space; if it is so, 
    //  eat the percent and check for spaces or a PE ref on the other side of it. 
    //  Otherwise, it has to be an entity reference for a general entity.
    //
    if (isPEDecl)
    {
        if(!fReaderMgr->getCurrentReader()->isWhitespace(fReaderMgr->peekNextChar()))
        {
            isPEDecl=false;
            while (true)
            {
               if (!expandPERef(false, false, true, false))
                  fScanner->emitError(XMLErrs::ExpectedEntityRefName);
               // And skip any more spaces in the expanded value
               if (fReaderMgr->skippedSpace())
                  fReaderMgr->skipPastSpaces();
               if (!fReaderMgr->skippedChar(chPercent))
                  break;
            }
        }
        else if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
    }

    //
    //  Now lets get a name, which should be the name of the entity. We
    //  have to get a buffer for this.
    //
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedPEName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // If namespaces are enabled, then no colons allowed
    if (fScanner->getDoNamespaces())
    {
        if (XMLString::indexOf(bbName.getRawBuffer(), chColon) != -1)
            fScanner->emitError(XMLErrs::ColonNotLegalWithNS);
    }

    //
    //  See if this entity already exists. If so, then the existing one
    //  takes precendence. So we use the local dummy decl to parse into
    //  and just ignore the results.
    //
    DTDEntityDecl* entityDecl;
    if (isPEDecl)
        entityDecl = fPEntityDeclPool->getByKey(bbName.getRawBuffer());
    else
        entityDecl = fDTDGrammar->getEntityDecl(bbName.getRawBuffer());

    if (entityDecl)
    {
        if (!fDumEntityDecl)
            fDumEntityDecl = new (fMemoryManager) DTDEntityDecl(fMemoryManager);
        fDumEntityDecl->setName(bbName.getRawBuffer());
        entityDecl = fDumEntityDecl;
    }
     else
    {
        // Its not in existence already, then create an entity decl for it
        entityDecl = new (fGrammarPoolMemoryManager) DTDEntityDecl(bbName.getRawBuffer(), false, fGrammarPoolMemoryManager);

        //
        //  Set the declaration location. The parameter indicates whether its
        //  declared in the content/internal subset, so we know whether or not
        //  its in the external subset.
        //
        entityDecl->setDeclaredInIntSubset(fInternalSubset);

        // Add it to the appropriate entity decl pool
        if (isPEDecl)
            fPEntityDeclPool->put(entityDecl);
         else
            fDTDGrammar->putEntityDecl(entityDecl);
    }

    // Set a flag that indicates whether we are ignoring this one
    const bool isIgnored = (entityDecl == fDumEntityDecl);

    // Set the PE flag on it
    entityDecl->setIsParameter(isPEDecl);

    //
    //  Space is legal (required actually) here so check for a PE ref. If
    //  we don't get our whitespace, then issue an error, but try to keep
    //  going.
    //
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // save the hasNoDTD status for Entity Constraint Checking
    bool hasNoDTD = fScanner->getHasNoDTD();
    if (hasNoDTD && isPEDecl)
        fScanner->setHasNoDTD(false);

    // According to the type call the value scanning method
    if (!scanEntityDef(*entityDecl, isPEDecl))
    {
        fReaderMgr->skipPastChar(chCloseAngle);
        fScanner->setHasNoDTD(true);
        fScanner->emitError(XMLErrs::ExpectedEntityValue);
        return;
    }
    if (hasNoDTD)
        fScanner->setHasNoDTD(true);

    // Space is legal (but not required) here so check for a PE ref
    checkForPERef(false, true);

    // And then we have to have the closing angle bracket
    if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedEntityDecl, entityDecl->getName());
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a doc type handler, then call it. But only call it for
    //  ignored elements if advanced callbacks are enabled.
    //
    if (fDocTypeHandler)
        fDocTypeHandler->entityDecl(*entityDecl, isPEDecl, isIgnored);
}